

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O3

void __thiscall
jwt::verifier<jwt::default_clock>::algo<jwt::algorithm::rs256>::algo
          (algo<jwt::algorithm::rs256> *this,rs256 *a)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  
  (this->super_algo_base)._vptr_algo_base = (_func_int **)&PTR__algo_00113c50;
  (this->alg).super_rsa.pkey.super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (a->super_rsa).pkey.super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (a->super_rsa).pkey.super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->alg).super_rsa.pkey.super___shared_ptr<evp_pkey_st,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->alg).super_rsa.md = (a->super_rsa).md;
  (this->alg).super_rsa.alg_name._M_dataplus._M_p = (pointer)&(this->alg).super_rsa.alg_name.field_2
  ;
  pcVar2 = (a->super_rsa).alg_name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->alg).super_rsa.alg_name,pcVar2,
             pcVar2 + (a->super_rsa).alg_name._M_string_length);
  return;
}

Assistant:

explicit algo(T a) : alg(a) {}